

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int findreplaceengine(bstring b,const_bstring find,const_bstring repl,int pos,instr_fnptr instr)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bstring b_00;
  const_bstring ptVar4;
  undefined1 *__dest;
  long lVar5;
  ulong uVar6;
  size_t __n;
  uint uVar7;
  undefined1 *__ptr;
  undefined1 *__ptr_00;
  long lVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  undefined1 *puVar12;
  long lVar13;
  int static_d [33];
  undefined1 local_b8 [136];
  
  if (b == (bstring)0x0) {
    return -1;
  }
  if (find == (const_bstring)0x0 || b->data == (uchar *)0x0) {
    return -1;
  }
  if (repl == (const_bstring)0x0 || find->data == (uchar *)0x0) {
    return -1;
  }
  if (pos < 0) {
    return -1;
  }
  if (repl->data == (uchar *)0x0) {
    return -1;
  }
  iVar3 = find->slen;
  if (iVar3 < 1) {
    return -1;
  }
  if (b->mlen < 1) {
    return -1;
  }
  uVar10 = b->slen;
  if ((uint)b->mlen < uVar10) {
    return -1;
  }
  if (repl->slen < 0) {
    return -1;
  }
  if ((int)(uVar10 - iVar3) < pos) {
    return 0;
  }
  lVar5 = (long)find->data - (long)b->data;
  b_00 = find;
  if ((lVar5 < (long)(ulong)uVar10 && pos - iVar3 < lVar5) &&
     (b_00 = bstrcpy(find), b_00 == (bstring)0x0)) {
    return -1;
  }
  lVar5 = (long)repl->data - (long)b->data;
  ptVar4 = repl;
  if ((((long)pos - (long)repl->slen < lVar5) && (lVar5 < b->slen)) &&
     (ptVar4 = bstrcpy(repl), ptVar4 == (bstring)0x0)) {
    iVar11 = -1;
    if (b_00 == find) {
      return -1;
    }
    goto LAB_00150e85;
  }
  uVar10 = b_00->slen - ptVar4->slen;
  if (uVar10 == 0) {
    for (uVar10 = (*instr)(b,pos,b_00); -1 < (int)uVar10;
        uVar10 = (*instr)(b,uVar10 + b_00->slen,b_00)) {
      memcpy(b->data + uVar10,ptVar4->data,(long)ptVar4->slen);
    }
joined_r0x00150e6d:
    if (b_00 != find) {
      bdestroy(b_00);
    }
    iVar11 = 0;
  }
  else {
    if (0 < (int)uVar10) {
      uVar1 = (*instr)(b,pos,b_00);
      if ((int)uVar1 < 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        lVar5 = 0;
        do {
          if ((lVar5 != 0) && (uVar1 - pos != 0 && pos <= (int)uVar1)) {
            memmove(b->data + pos + lVar5,b->data + pos,(long)(int)(uVar1 - pos));
          }
          if ((long)ptVar4->slen != 0) {
            memcpy(b->data + lVar5 + (ulong)uVar1,ptVar4->data,(long)ptVar4->slen);
          }
          pos = uVar1 + b_00->slen;
          uVar1 = (*instr)(b,pos,b_00);
          lVar5 = lVar5 - (ulong)uVar10;
          uVar6 = (ulong)((int)uVar6 + uVar10);
        } while (-1 < (int)uVar1);
      }
      if ((int)uVar6 != 0) {
        iVar3 = b->slen - pos;
        if (iVar3 != 0 && pos <= b->slen) {
          memmove(b->data + pos + -uVar6,b->data + pos,(long)iVar3);
        }
        lVar5 = (long)b->slen - (long)(int)uVar6;
        b->slen = (int)lVar5;
        b->data[lVar5] = '\0';
      }
      goto joined_r0x00150e6d;
    }
    __ptr_00 = local_b8;
    uVar1 = 0x20;
    iVar3 = 0;
    uVar6 = 0;
    do {
      iVar2 = (*instr)(b,pos,b_00);
      if (iVar2 < 0) {
        *(int *)(__ptr_00 + (uVar6 & 0xffffffff) * 4) = b->slen;
        iVar2 = balloc(b,(b->slen - iVar3) + 1);
        iVar11 = -1;
        if (iVar2 == 0) {
          b->slen = b->slen - iVar3;
          if (uVar6 != 0) {
            lVar5 = uVar6 + 1;
            lVar13 = (long)-iVar3;
            do {
              lVar8 = (long)b_00->slen + (long)*(int *)(__ptr_00 + (ulong)((int)lVar5 - 2) * 4);
              iVar3 = *(int *)(__ptr_00 + lVar5 * 4 + -4) - (int)lVar8;
              if (iVar3 != 0) {
                memmove(b->data + lVar8 + lVar13,b->data + lVar8,(long)iVar3);
              }
              __n = (size_t)ptVar4->slen;
              if (__n != 0) {
                memmove(b->data + lVar13 + (lVar8 - __n),ptVar4->data,__n);
              }
              lVar13 = lVar13 + (int)uVar10;
              lVar5 = lVar5 + -1;
            } while (1 < lVar5);
          }
          b->data[b->slen] = '\0';
          iVar11 = 0;
        }
        goto LAB_00150f87;
      }
      if ((long)(int)(uVar1 - 1) <= (long)uVar6) {
        if (uVar1 < 0x8000000) {
          uVar7 = uVar1 * 2;
          puVar12 = (undefined1 *)0x0;
          __ptr = __ptr_00;
          if (local_b8 == __ptr_00) {
            __ptr = puVar12;
          }
          __dest = (undefined1 *)realloc(__ptr,(ulong)(uVar1 << 4));
          __ptr_00 = __ptr;
          if ((__dest != (undefined1 *)0x0) &&
             (puVar12 = (undefined1 *)0x1, __ptr_00 = __dest, __ptr == (undefined1 *)0x0)) {
            memcpy(__dest,local_b8,0x84);
          }
          cVar9 = (char)puVar12;
        }
        else {
          cVar9 = '\0';
          uVar7 = uVar1;
        }
        uVar1 = uVar7;
        if (cVar9 == '\0') break;
      }
      *(int *)(__ptr_00 + uVar6 * 4) = iVar2;
      uVar6 = uVar6 + 1;
      iVar3 = iVar3 + uVar10;
      pos = iVar2 + b_00->slen;
    } while (-1 < pos);
    iVar11 = -1;
LAB_00150f87:
    if (local_b8 != __ptr_00) {
      free(__ptr_00);
    }
    if (b_00 != find) {
      bdestroy(b_00);
    }
  }
  b_00 = ptVar4;
  if (ptVar4 == repl) {
    return iVar11;
  }
LAB_00150e85:
  bdestroy(b_00);
  return iVar11;
}

Assistant:

static int findreplaceengine (bstring b, const_bstring find,
                              const_bstring repl, int pos,
                              instr_fnptr instr) {
int i, ret, slen, mlen, delta, acc;
int * d;
int static_d[INITIAL_STATIC_FIND_INDEX_COUNT+1]; /* This +1 is for LINT. */
ptrdiff_t pd;
bstring auxf = (bstring) find;
bstring auxr = (bstring) repl;

	if (b == NULL || b->data == NULL || find == NULL ||
		find->data == NULL || repl == NULL || repl->data == NULL ||
		pos < 0 || find->slen <= 0 || b->mlen <= 0 || b->slen > b->mlen ||
		b->slen < 0 || repl->slen < 0) return BSTR_ERR;
	if (pos > b->slen - find->slen) return BSTR_OK;

	/* Alias with find string */
	pd = (ptrdiff_t) (find->data - b->data);
	if ((ptrdiff_t) (pos - find->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxf = bstrcpy (find))) return BSTR_ERR;
	}

	/* Alias with repl string */
	pd = (ptrdiff_t) (repl->data - b->data);
	if ((ptrdiff_t) (pos - repl->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxr = bstrcpy (repl))) {
			if (auxf != find) bdestroy (auxf);
			return BSTR_ERR;
		}
	}

	delta = auxf->slen - auxr->slen;

	/* in-place replacement since find and replace strings are of equal
	   length */
	if (delta == 0) {
		while ((pos = instr (b, pos, auxf)) >= 0) {
			bstr__memcpy (b->data + pos, auxr->data, auxr->slen);
			pos += auxf->slen;
		}
		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return BSTR_OK;
	}

	/* shrinking replacement since auxf->slen > auxr->slen */
	if (delta > 0) {
		acc = 0;

		while ((i = instr (b, pos, auxf)) >= 0) {
			if (acc && i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			if (auxr->slen)
				bstr__memcpy (b->data + i - acc, auxr->data, auxr->slen);
			acc += delta;
			pos = i + auxf->slen;
		}

		if (acc) {
			i = b->slen;
			if (i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			b->slen -= acc;
			b->data[b->slen] = (unsigned char) '\0';
		}

		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return BSTR_OK;
	}

	/* expanding replacement since find->slen < repl->slen.  Its a lot
	   more complicated.  This works by first finding all the matches and
	   storing them to a growable array, then doing at most one resize of
	   the destination bstring and then performing the direct memory transfers
	   of the string segment pieces to form the final result. The growable
	   array of matches uses a deferred doubling reallocing strategy.  What
	   this means is that it starts as a reasonably fixed sized auto array in
	   the hopes that many if not most cases will never need to grow this
	   array.  But it switches as soon as the bounds of the array will be
	   exceeded.  An extra find result is always appended to this array that
	   corresponds to the end of the destination string, so slen is checked
	   against mlen - 1 rather than mlen before resizing.
	*/

	mlen = INITIAL_STATIC_FIND_INDEX_COUNT;
	d = (int *) static_d; /* Avoid malloc for trivial/initial cases */
	acc = slen = 0;

	while ((pos = instr (b, pos, auxf)) >= 0) {
		if (slen >= mlen - 1) {
			int *t;
			int sl;
			/* Overflow */
			if (mlen > (INT_MAX / sizeof(int *)) / 2) {
				ret = BSTR_ERR;
				goto done;
			}
			mlen += mlen;
			sl = sizeof (int *) * mlen;
			if (static_d == d) d = NULL; /* static_d cannot be realloced */
			if (NULL == (t = (int *) bstr__realloc (d, sl))) {
				ret = BSTR_ERR;
				goto done;
			}
			if (NULL == d) bstr__memcpy (t, static_d, sizeof (static_d));
			d = t;
		}
		d[slen] = pos;
		slen++;
		acc -= delta;
		pos += auxf->slen;
		if (pos < 0 || acc < 0) {
			ret = BSTR_ERR;
			goto done;
		}
	}

	/* slen <= INITIAL_STATIC_INDEX_COUNT-1 or mlen-1 here. */
	d[slen] = b->slen;

	if (BSTR_OK == (ret = balloc (b, b->slen + acc + 1))) {
		b->slen += acc;
		for (i = slen-1; i >= 0; i--) {
			int s, l;
			s = d[i] + auxf->slen;
			l = d[i+1] - s; /* d[slen] may be accessed here. */
			if (l) {
				bstr__memmove (b->data + s + acc, b->data + s, l);
			}
			if (auxr->slen) {
				bstr__memmove (b->data + s + acc - auxr->slen,
				               auxr->data, auxr->slen);
			}
			acc += delta;
		}
		b->data[b->slen] = (unsigned char) '\0';
	}

	done:;
	if (static_d != d) bstr__free (d);
	if (auxf != find) bdestroy (auxf);
	if (auxr != repl) bdestroy (auxr);
	return ret;
}